

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

char p_b_coll_elem(parse *p,int endc)

{
  char *__s2;
  int iVar1;
  int iVar2;
  bool bVar3;
  cname *pcStack_30;
  int len;
  cname *cp;
  char *sp;
  int endc_local;
  parse *p_local;
  
  __s2 = p->next;
  while( true ) {
    bVar3 = false;
    if (p->next < p->end) {
      bVar3 = false;
      if (((p->next < p->end) && (bVar3 = false, p->next + 1 < p->end)) &&
         (bVar3 = false, *p->next == endc)) {
        bVar3 = p->next[1] == ']';
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (!bVar3) break;
    p->next = p->next + 1;
  }
  if (p->next < p->end) {
    iVar1 = (int)p->next - (int)__s2;
    for (pcStack_30 = cnames; pcStack_30->name != (char *)0x0; pcStack_30 = pcStack_30 + 1) {
      iVar2 = strncmp(pcStack_30->name,__s2,(long)iVar1);
      if ((iVar2 == 0) && (pcStack_30->name[iVar1] == '\0')) {
        return pcStack_30->code;
      }
    }
    if (iVar1 == 1) {
      p_local._7_1_ = *__s2;
    }
    else {
      seterr(p,3);
      p_local._7_1_ = '\0';
    }
  }
  else {
    seterr(p,7);
    p_local._7_1_ = '\0';
  }
  return p_local._7_1_;
}

Assistant:

static char			/* value of collating element */
p_b_coll_elem(p, endc)
register struct parse *p;
int endc;			/* name ended by endc,']' */
{
	register char *sp = p->next;
	register struct cname *cp;
	register int len;

	while (MORE() && !SEETWO(endc, ']'))
		NEXT();
	if (!MORE()) {
		SETERROR(REG_EBRACK);
		return(0);
	}
	len = (int) (p->next - sp);
	for (cp = cnames; cp->name != NULL; cp++)
		if (strncmp(cp->name, sp, len) == 0 && cp->name[len] == '\0')
			return(cp->code);	/* known name */
	if (len == 1)
		return(*sp);	/* single character */
	SETERROR(REG_ECOLLATE);			/* neither */
	return(0);
}